

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

FillStaticLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_fillstatic(NeuralNetworkLayer *this)

{
  FillStaticLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x43d) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x43d;
    this_00 = (FillStaticLayerParams *)operator_new(0x30);
    FillStaticLayerParams::FillStaticLayerParams(this_00);
    (this->layer_).fillstatic_ = this_00;
  }
  return (FillStaticLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::FillStaticLayerParams* NeuralNetworkLayer::mutable_fillstatic() {
  if (!has_fillstatic()) {
    clear_layer();
    set_has_fillstatic();
    layer_.fillstatic_ = new ::CoreML::Specification::FillStaticLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.fillStatic)
  return layer_.fillstatic_;
}